

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O0

parser_error parse_quest_map(parser *p)

{
  int iVar1;
  void *pvVar2;
  char *__s1;
  long *local_38;
  quest_place *q_place;
  level_map *map;
  char *name;
  quest *q;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  __s1 = parser_getstr(p,"mapname");
  q_place = (quest_place *)maps;
  local_38 = *(long **)((long)pvVar2 + 0x18);
  if (pvVar2 == (void *)0x0) {
    __assert_fail("q",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-quest.c"
                  ,0x7a,"enum parser_error parse_quest_map(struct parser *)");
  }
  if (local_38 == (long *)0x0) {
    local_38 = (long *)mem_zalloc(0x18);
    *(long **)((long)pvVar2 + 0x18) = local_38;
  }
  else {
    for (; *(long *)((long)local_38 + 0x10) != 0; local_38 = *(long **)((long)local_38 + 0x10)) {
    }
    pvVar2 = mem_zalloc(0x18);
    *(void **)((long)local_38 + 0x10) = pvVar2;
    local_38 = *(long **)((long)local_38 + 0x10);
  }
  do {
    if (q_place == (quest_place *)0x0) {
LAB_00205447:
      if (*local_38 == 0) {
        p_local._4_4_ = PARSE_ERROR_INVALID_MAP;
      }
      else {
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
      return p_local._4_4_;
    }
    iVar1 = strcmp(__s1,(char *)q_place->map);
    if (iVar1 == 0) {
      *local_38 = (long)q_place;
      goto LAB_00205447;
    }
    q_place = q_place[1].next;
  } while( true );
}

Assistant:

static enum parser_error parse_quest_map(struct parser *p) {
	struct quest *q = parser_priv(p);
	const char *name = parser_getstr(p, "mapname");
	struct level_map *map = maps;
	struct quest_place *q_place = q->place;
	assert(q);

	if (q_place) {
		while (q_place->next) {
			q_place = q_place->next;
		}
		q_place->next = mem_zalloc(sizeof(*(q->place)));
		q_place = q_place->next;
	} else {
		q_place = mem_zalloc(sizeof(*(q->place)));
		q->place = q_place;
	}

	while (map) {
		if (streq(name, map->name)) {
			q_place->map = map;
			break;
		}
		map = map->next;
	}

	if (!q_place->map) return PARSE_ERROR_INVALID_MAP;

	return PARSE_ERROR_NONE;
}